

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * __thiscall
QUtil::qpdf_time_to_pdf_time_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,QPDFTime *qtm)

{
  int in_ECX;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_3c;
  undefined1 local_38 [4];
  int t;
  string tz_offset;
  QPDFTime *qtm_local;
  
  tz_offset.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  local_3c = *(int *)(tz_offset.field_2._8_8_ + 0x18);
  if (local_3c == 0) {
    std::__cxx11::string::operator=((string *)local_38,"Z");
  }
  else {
    if (local_3c < 0) {
      local_3c = -local_3c;
      std::__cxx11::string::operator+=((string *)local_38,"+");
    }
    else {
      std::__cxx11::string::operator+=((string *)local_38,"-");
    }
    int_to_string_abi_cxx11_(&local_d0,(QUtil *)(long)(local_3c / 0x3c),2,-(local_3c >> 0x1f));
    std::operator+(&local_b0,&local_d0,"\'");
    in_ECX = (local_3c / 0x3c) * 0x3c;
    int_to_string_abi_cxx11_(&local_f0,(QUtil *)(long)(local_3c % 0x3c),2,in_ECX);
    std::operator+(&local_90,&local_b0,&local_f0);
    std::operator+(&local_70,&local_90,"\'");
    std::__cxx11::string::operator+=((string *)local_38,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  int_to_string_abi_cxx11_(&local_1d0,(QUtil *)(long)*(int *)tz_offset.field_2._8_8_,4,in_ECX);
  std::operator+(&local_1b0,"D:",&local_1d0);
  int_to_string_abi_cxx11_(&local_1f0,(QUtil *)(long)*(int *)(tz_offset.field_2._8_8_ + 4),2,in_ECX)
  ;
  std::operator+(&local_190,&local_1b0,&local_1f0);
  int_to_string_abi_cxx11_(&local_210,(QUtil *)(long)*(int *)(tz_offset.field_2._8_8_ + 8),2,in_ECX)
  ;
  std::operator+(&local_170,&local_190,&local_210);
  int_to_string_abi_cxx11_
            (&local_230,(QUtil *)(long)*(int *)(tz_offset.field_2._8_8_ + 0xc),2,in_ECX);
  std::operator+(&local_150,&local_170,&local_230);
  int_to_string_abi_cxx11_
            (&local_250,(QUtil *)(long)*(int *)(tz_offset.field_2._8_8_ + 0x10),2,in_ECX);
  std::operator+(&local_130,&local_150,&local_250);
  int_to_string_abi_cxx11_
            (&local_270,(QUtil *)(long)*(int *)(tz_offset.field_2._8_8_ + 0x14),2,in_ECX);
  std::operator+(&local_110,&local_130,&local_270);
  std::operator+(__return_storage_ptr__,&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::qpdf_time_to_pdf_time(QPDFTime const& qtm)
{
    std::string tz_offset;
    int t = qtm.tz_delta;
    if (t == 0) {
        tz_offset = "Z";
    } else {
        if (t < 0) {
            t = -t;
            tz_offset += "+";
        } else {
            tz_offset += "-";
        }
        tz_offset += QUtil::int_to_string(t / 60, 2) + "'" + QUtil::int_to_string(t % 60, 2) + "'";
    }
    return (
        "D:" + QUtil::int_to_string(qtm.year, 4) + QUtil::int_to_string(qtm.month, 2) +
        QUtil::int_to_string(qtm.day, 2) + QUtil::int_to_string(qtm.hour, 2) +
        QUtil::int_to_string(qtm.minute, 2) + QUtil::int_to_string(qtm.second, 2) + tz_offset);
}